

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

DataType deqp::gles3::Functional::getSamplerLookupReturnType(DataType type)

{
  DataType local_c;
  DataType type_local;
  
  switch(type) {
  case TYPE_SAMPLER_2D:
  case TYPE_SAMPLER_CUBE:
  case TYPE_SAMPLER_2D_ARRAY:
  case TYPE_SAMPLER_3D:
    local_c = TYPE_FLOAT_VEC4;
    break;
  default:
    local_c = TYPE_LAST;
    break;
  case TYPE_SAMPLER_2D_SHADOW:
  case TYPE_SAMPLER_CUBE_SHADOW:
  case TYPE_SAMPLER_2D_ARRAY_SHADOW:
    local_c = TYPE_FLOAT;
    break;
  case TYPE_INT_SAMPLER_2D:
  case TYPE_INT_SAMPLER_CUBE:
  case TYPE_INT_SAMPLER_2D_ARRAY:
  case TYPE_INT_SAMPLER_3D:
    local_c = TYPE_INT_VEC4;
    break;
  case TYPE_UINT_SAMPLER_2D:
  case TYPE_UINT_SAMPLER_CUBE:
  case TYPE_UINT_SAMPLER_2D_ARRAY:
  case TYPE_UINT_SAMPLER_3D:
    local_c = TYPE_UINT_VEC4;
  }
  return local_c;
}

Assistant:

static inline glu::DataType getSamplerLookupReturnType (const glu::DataType type)
{
	switch (type)
	{
		case glu::TYPE_SAMPLER_2D:
		case glu::TYPE_SAMPLER_CUBE:
		case glu::TYPE_SAMPLER_2D_ARRAY:
		case glu::TYPE_SAMPLER_3D:
			return glu::TYPE_FLOAT_VEC4;

		case glu::TYPE_UINT_SAMPLER_2D:
		case glu::TYPE_UINT_SAMPLER_CUBE:
		case glu::TYPE_UINT_SAMPLER_2D_ARRAY:
		case glu::TYPE_UINT_SAMPLER_3D:
			return glu::TYPE_UINT_VEC4;

		case glu::TYPE_INT_SAMPLER_2D:
		case glu::TYPE_INT_SAMPLER_CUBE:
		case glu::TYPE_INT_SAMPLER_2D_ARRAY:
		case glu::TYPE_INT_SAMPLER_3D:
			return glu::TYPE_INT_VEC4;

		case glu::TYPE_SAMPLER_2D_SHADOW:
		case glu::TYPE_SAMPLER_CUBE_SHADOW:
		case glu::TYPE_SAMPLER_2D_ARRAY_SHADOW:
			return glu::TYPE_FLOAT;

		default:
			DE_ASSERT(false);
			return glu::TYPE_LAST;
	}
}